

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadDirectionalLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  DirectionalLight *this_00;
  undefined8 in_RDX;
  Node *in_RDI;
  Vec3fa VVar1;
  DirectionalLight light;
  Vec3fa D;
  Vec3fa E;
  AffineSpace3fa space;
  Ref<embree::XML> *in_stack_00000790;
  XMLLoader *in_stack_00000798;
  Vec3fa *in_stack_fffffffffffffdd0;
  DirectionalLight *in_stack_fffffffffffffdd8;
  LightNodeImpl<embree::SceneGraph::DirectionalLight> *this_01;
  Ref<embree::XML> *in_stack_fffffffffffffe48;
  XMLLoader *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  undefined1 local_168 [24];
  string local_150 [32];
  long *local_130 [5];
  allocator local_101;
  string local_100 [32];
  long *local_e0 [9];
  undefined8 local_98;
  undefined8 local_80;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined1 *local_60;
  long **local_58;
  long **local_48;
  DirectionalLight *local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_98 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"AffineSpace",&local_101);
  XML::child((XML *)in_stack_fffffffffffffe90,(string *)in_stack_fffffffffffffe88);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_00000798,in_stack_00000790);
  local_58 = local_e0;
  if (local_e0[0] != (long *)0x0) {
    (**(code **)(*local_e0[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  local_80 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"E",(allocator *)(local_168 + 0x17));
  XML::child((XML *)in_stack_fffffffffffffe90,(string *)in_stack_fffffffffffffe88);
  VVar1 = load<embree::Vec3fa>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_48 = local_130;
  if (local_130[0] != (long *)0x0) {
    (**(code **)(*local_130[0] + 0x18))(VVar1.field_0._0_4_,VVar1.field_0._8_8_);
  }
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)(local_168 + 0x17));
  local_60 = local_168;
  local_64 = 0;
  local_68 = 0;
  local_6c = 0x3f800000;
  local_4 = 0;
  local_8 = 0x3f800000;
  local_c = 0;
  local_10 = 0;
  local_28 = 0;
  uStack_20 = 0x3f800000;
  local_168._0_8_ = 0;
  local_168._8_8_ = 0x3f800000;
  this_01 = (LightNodeImpl<embree::SceneGraph::DirectionalLight> *)&stack0xfffffffffffffe68;
  SceneGraph::DirectionalLight::DirectionalLight
            ((DirectionalLight *)this_01,(Vec3fa *)in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffdd0);
  this_00 = (DirectionalLight *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>::operator_new(0x381637);
  SceneGraph::DirectionalLight::transform(this_00,(AffineSpace3fa *)this_01);
  SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>::LightNodeImpl
            (this_01,in_stack_fffffffffffffdd8);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_38 = this_00;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadDirectionalLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa E = load<Vec3fa>(xml->child("E"));
    const Vec3fa D = Vec3fa(0,0,1);
    const SceneGraph::DirectionalLight light = SceneGraph::DirectionalLight(D,E);
    return new SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>(light.transform(space));
  }